

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_timer.c
# Opt level: O0

void oonf_timer_walk(void)

{
  list_entity *plVar1;
  int iVar2;
  list_entity *plVar3;
  list_entity *__tempptr;
  uint64_t end_time;
  uint64_t start_time;
  oonf_timer_class *info;
  oonf_timer_instance *timer;
  list_entity **local_68;
  undefined4 local_60;
  oonf_log_source local_5c;
  undefined *local_58;
  undefined4 local_50;
  oonf_log_source local_4c;
  undefined *local_48;
  undefined4 local_40;
  oonf_log_source local_3c;
  undefined *local_38;
  avl_tree *local_30;
  list_entity **local_28;
  uint64_t *local_20;
  list_entity *local_18;
  oonf_timer_class *local_10;
  
  _scheduling_now = true;
  while( true ) {
    local_30 = &_timer_tree;
    if (_timer_tree.count == 0) {
      _scheduling_now = false;
      return;
    }
    info = (oonf_timer_class *)_timer_tree.list_head.next;
    plVar1 = _timer_tree.list_head.next[5].prev;
    plVar3 = (list_entity *)oonf_clock_getNow();
    if (plVar3 < plVar1) break;
    local_38 = &log_global_mask;
    local_3c = _oonf_timer_subsystem.logging;
    local_40 = 1;
    if (((&log_global_mask)[_oonf_timer_subsystem.logging] & 1) != 0) {
      oonf_log(1,_oonf_timer_subsystem.logging,"src/base/oonf_timer.c",0x104,0,0,
               "TIMER: fire \'%s\' at clocktick %lu\n",(info->_timer_in_callback->_node).parent,
               info[1].name);
    }
    start_time = (uint64_t)info->_timer_in_callback;
    ((oonf_timer_instance *)start_time)->class = info;
    ((oonf_timer_instance *)start_time)->jitter_pct = '\0';
    *(int *)((long)&(((oonf_timer_instance *)start_time)->_node).key + 4) =
         *(int *)((long)&(((oonf_timer_instance *)start_time)->_node).key + 4) + 1;
    if (info[1]._node.next == (list_entity *)0x0) {
      oonf_timer_stop((oonf_timer_instance *)info);
    }
    local_20 = &end_time;
    os_clock_linux_gettime64(local_20);
    (*(code *)(info->_timer_in_callback->_node).left)(info);
    local_28 = &__tempptr;
    os_clock_linux_gettime64(local_28);
    if (100 < (long)__tempptr - end_time) {
      local_48 = &log_global_mask;
      local_4c = _oonf_timer_subsystem.logging;
      local_50 = 4;
      if (((&log_global_mask)[_oonf_timer_subsystem.logging] & 4) != 0) {
        oonf_log(4,_oonf_timer_subsystem.logging,"src/base/oonf_timer.c",0x11b,0,0,
                 "Timer %s scheduling took %lu ms",(info->_timer_in_callback->_node).parent,
                 (long)__tempptr - end_time);
      }
      *(int *)(start_time + 0x30) = *(int *)(start_time + 0x30) + 1;
    }
    if ((*(byte *)(start_time + 0x40) & 1) == 0) {
      local_68 = &info[1]._node.prev;
      timer = (oonf_timer_instance *)0x4;
      iVar2 = os_core_linux_get_random(local_68,4);
      if (iVar2 != 0) {
        local_58 = &log_global_mask;
        local_5c = _oonf_timer_subsystem.logging;
        local_60 = 4;
        if (((&log_global_mask)[_oonf_timer_subsystem.logging] & 4) != 0) {
          oonf_log(4,_oonf_timer_subsystem.logging,"src/base/oonf_timer.c",0x129,0,0,
                   "Could not get random data");
        }
        *(undefined4 *)&info[1]._node.prev = 0;
      }
      local_18 = info[1]._node.next;
      local_10 = info;
      oonf_timer_start_ext((oonf_timer_instance *)info,(uint64_t)local_18,(uint64_t)local_18);
    }
  }
  _scheduling_now = false;
  return;
}

Assistant:

void
oonf_timer_walk(void) {
  struct oonf_timer_instance *timer;
  struct oonf_timer_class *info;
  uint64_t start_time, end_time;

  _scheduling_now = true;

  while (!avl_is_empty(&_timer_tree)) {
    timer = avl_first_element(&_timer_tree, timer, _node);

    if (timer->_clock > oonf_clock_getNow()) {
      break;
    }

    OONF_DEBUG(LOG_TIMER, "TIMER: fire '%s' at clocktick %" PRIu64 "\n", timer->class->name, timer->_clock);

    /*
     * The timer->info pointer is invalidated by oonf_timer_stop()
     */
    info = timer->class;
    info->_timer_in_callback = timer;
    info->_timer_stopped = false;

    /* update statistics */
    info->_stat_fired++;

    if (timer->_period == 0) {
      /* stop now, the data structure might not be available anymore later */
      oonf_timer_stop(timer);
    }

    /* This timer is expired, call into the provided callback function */
    os_clock_gettime64(&start_time);
    timer->class->callback(timer);
    os_clock_gettime64(&end_time);

    if (end_time - start_time > OONF_TIMER_SLICE) {
      OONF_WARN(LOG_TIMER, "Timer %s scheduling took %" PRIu64 " ms", timer->class->name, end_time - start_time);
      info->_stat_long++;
    }

    /*
     * Only act on actually running timers, the callback might have
     * called oonf_timer_stop() !
     */
    if (!info->_timer_stopped) {
      /*
       * Timer has been not been stopped, so its periodic.
       * rehash the random number and restart.
       */
      if (os_core_get_random(&timer->_random, sizeof(timer->_random))) {
        OONF_WARN(LOG_TIMER, "Could not get random data");
        timer->_random = 0;
      }
      oonf_timer_start(timer, timer->_period);
    }
  }

  _scheduling_now = false;
}